

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::AtomicCompSwapCase::ReturnValueVerifier::operator()
          (ReturnValueVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  bool bVar2;
  long *plVar3;
  char *__s;
  undefined8 *puVar4;
  int *piVar5;
  int iVar6;
  TestLog *pTVar7;
  ConstPixelBufferAccess *pCVar8;
  long lVar9;
  int iVar10;
  void *__buf;
  Vector<int,_2> (*arr) [5];
  int (*arr_00) [5];
  Vector<int,_3> (*arr_01) [5];
  int (*arr_02) [5];
  int (*arr_03) [5];
  int i;
  long lVar11;
  int iVar12;
  int iVar13;
  size_type *psVar14;
  int x;
  uint y_00;
  ulong uVar15;
  int y;
  int compareArgs [5];
  int z;
  IVec2 pixelCoords [5];
  int returnValues [5];
  IVec3 invocationGlobalIDs [5];
  bool local_7da;
  allocator<char> local_7c9;
  TextureFormat local_7c8;
  ConstPixelBufferAccess *local_7c0;
  ChannelOrder local_7b8 [5];
  undefined1 local_7a4 [12];
  ReturnValueVerifier *local_798;
  int local_790;
  int local_78c;
  long *local_788 [2];
  long local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  long *local_758 [2];
  long local_748 [2];
  ChannelOrder local_738 [8];
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  undefined8 uStack_658;
  undefined4 uStack_650;
  undefined4 local_64c;
  undefined4 uStack_648;
  undefined8 uStack_644;
  undefined1 local_630 [112];
  ios_base local_5c0 [8];
  ios_base local_5b8 [264];
  undefined1 local_4b0 [8];
  undefined1 local_4a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0 [6];
  ios_base local_438 [264];
  undefined1 local_330 [8];
  undefined1 local_328 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300 [4];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [16];
  TestLog local_1a0;
  ios_base local_138 [264];
  
  local_7c8 = (TextureFormat)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
  std::ostream::operator<<((ostringstream *)local_630,sliceOrFaceNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
  std::ios_base::~ios_base(local_5c0);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1b0,0,(char *)0x0,0x1c92c0b);
  pTVar7 = (TestLog *)(plVar3 + 2);
  if ((TestLog *)*plVar3 == pTVar7) {
    local_4a0[0]._0_8_ = pTVar7->m_log;
    local_4a0[0]._8_8_ = plVar3[3];
    local_4b0 = (undefined1  [8])(local_4a8 + 8);
  }
  else {
    local_4a0[0]._0_8_ = pTVar7->m_log;
    local_4b0 = (undefined1  [8])*plVar3;
  }
  local_4a8 = (undefined1  [8])plVar3[1];
  *plVar3 = (long)pTVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (this->m_imageType == TEXTURETYPE_CUBE) {
    __s = glu::getCubeMapFaceName
                    ((&DAT_01c91b3c)
                     [(int)(&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces
                           )[sliceOrFaceNdx]]);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_758,__s,&local_7c9);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_758,0,(char *)0x0,0x1cfa86a);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
    std::ostream::operator<<(local_630,sliceOrFaceNdx);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
    std::ios_base::~ios_base(local_5c0);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_758,0,(char *)0x0,0x1c92647);
  }
  local_788[0] = &local_778;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_778 = *plVar3;
    uStack_770 = puVar4[3];
  }
  else {
    local_778 = *plVar3;
    local_788[0] = (long *)*puVar4;
  }
  local_788[1] = (long *)puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  local_7c0 = resultSlice;
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_788,0,(char *)0x0,0x1c92c18);
  psVar14 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_678.field_2._M_allocated_capacity = *psVar14;
    local_678.field_2._8_8_ = plVar3[3];
    local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  }
  else {
    local_678.field_2._M_allocated_capacity = *psVar14;
    local_678._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_678._M_string_length = plVar3[1];
  *plVar3 = (long)psVar14;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pCVar8 = local_7c0;
  tcu::LogImage::LogImage
            ((LogImage *)local_330,(string *)local_4b0,&local_678,local_7c0,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_330,local_7c8.order,__buf,(size_t)pCVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_p != local_300) {
    operator_delete(local_310._M_p,local_300[0]._M_allocated_capacity + 1);
  }
  if (local_330 != (undefined1  [8])(local_328 + 8)) {
    operator_delete((void *)local_330,local_320._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  pCVar8 = local_7c0;
  if (local_788[0] != &local_778) {
    operator_delete(local_788[0],local_778 + 1);
  }
  if (local_758[0] != local_748) {
    operator_delete(local_758[0],local_748[0] + 1);
  }
  if (local_4b0 != (undefined1  [8])(local_4a8 + 8)) {
    operator_delete((void *)local_4b0,(ulong)(local_4a0[0]._M_allocated_capacity + 1));
  }
  if ((TestLog *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0.m_log)->flags + 1));
  }
  iVar6 = (pCVar8->m_size).m_data[1];
  local_7da = iVar6 < 1;
  if (0 < iVar6) {
    local_790 = sliceOrFaceNdx * sliceOrFaceNdx;
    lVar9 = 0;
    local_798 = this;
    local_78c = sliceOrFaceNdx;
    do {
      bVar2 = 0 < this->m_endResultImageWidth;
      if (0 < this->m_endResultImageWidth) {
        iVar6 = (int)lVar9;
        iVar12 = iVar6 * iVar6 + local_790;
        iVar13 = 0;
        do {
          uStack_648 = 0;
          uStack_644 = 0;
          uStack_658 = 0;
          uStack_650 = 0;
          local_64c = 0;
          local_678.field_2._M_allocated_capacity = 0;
          local_678.field_2._8_8_ = 0;
          local_678._M_dataplus._M_p = (pointer)0x0;
          local_678._M_string_length = 0;
          local_778 = 0;
          uStack_770 = 0;
          local_788[0] = (long *)0x0;
          local_788[1] = (long *)0x0;
          local_768 = 0;
          psVar14 = &local_678._M_string_length;
          lVar11 = 0;
          do {
            y_00 = local_798->m_endResultImageWidth * (int)lVar11 + iVar13;
            local_788[lVar11] = (long *)(lVar9 << 0x20 | (ulong)y_00);
            *(uint *)&(((string *)(psVar14 + -1))->_M_dataplus)._M_p = y_00;
            *(int *)((long)psVar14 + -4) = iVar6;
            *(int *)psVar14 = local_78c;
            tcu::ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)local_630,(int)local_7c0,y_00,iVar6);
            this = local_798;
            local_738[lVar11] = local_630._0_4_;
            iVar10 = (int)y_00 % local_798->m_endResultImageWidth;
            local_7b8[lVar11] =
                 ((int)y_00 / local_798->m_endResultImageWidth) * 0x2a + iVar10 * iVar10 + iVar12;
            lVar11 = lVar11 + 1;
            psVar14 = (size_type *)((long)psVar14 + 0xc);
          } while (lVar11 != 5);
          uVar15 = 0;
          iVar10 = 0;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          this_00 = (ostringstream *)(local_630 + 8);
          do {
            if ((local_738[uVar15] != local_7b8[iVar10]) &&
               ((uVar15 == 0 || (iVar10 = iVar10 + 1, local_738[uVar15] != local_7b8[iVar10]))))
            goto LAB_014a5c5d;
            uVar15 = uVar15 + 1;
          } while (uVar15 != 5);
          uVar15 = 0xffffffff;
LAB_014a5c5d:
          iVar10 = (int)uVar15;
          if (-1 < iVar10) {
            local_1b0._0_4_ = local_7c8.order;
            local_1b0._4_4_ = local_7c8.type;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"// Failure: intermediate return values at pixels ",0x31);
            arrayStr<tcu::Vector<int,2>,5>(&local_698,(Functional *)local_788,arr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_698._M_dataplus._M_p,local_698._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," of current layer are ",0x16);
            arrayStr<int,5>(&local_6b8,(Functional *)local_738,arr_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_6b8._M_dataplus._M_p,local_6b8._M_string_length);
            local_4b0 = (undefined1  [8])
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1b0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4a8,"// Note: relevant shader invocation global IDs are ",
                       0x33);
            arrayStr<tcu::Vector<int,3>,5>(&local_6d8,(Functional *)&local_678,arr_01);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4a8,local_6d8._M_dataplus._M_p,local_6d8._M_string_length);
            local_330 = (undefined1  [8])
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_4b0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,"// Note: \'compare\' argument values for the IDs are ",
                       0x33);
            arrayStr<int,5>(&local_6f8,(Functional *)local_7b8,arr_02);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,local_6f8._M_dataplus._M_p,local_6f8._M_string_length);
            local_630._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,
                       "// Note: expected the return value sequence to fulfill the following conditions:\n"
                       ,0x51);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"// - first value is ",0x14);
            std::ostream::operator<<(this_00,local_7b8[0]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,
                       "// - each value other than the first is either the same as the one just before it, or the smallest value (in the sequence "
                       ,0x7a);
            arrayStr<int,5>(&local_718,(Functional *)local_7b8,arr_03);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,local_718._M_dataplus._M_p,local_718._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,") bigger than the one just before it",0x24);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_718._M_dataplus._M_p != &local_718.field_2) {
              operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_5b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
              operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
            std::ios_base::~ios_base(local_2b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
              operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
            std::ios_base::~ios_base(local_438);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
              operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_698._M_dataplus._M_p != &local_698.field_2) {
              operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            if (iVar10 == 0) {
              local_630._0_4_ = local_7c8.order;
              local_630._4_4_ = local_7c8.type;
              poVar1 = (ostringstream *)(local_630 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"// Note: the first return value (",0x21);
              std::ostream::operator<<(poVar1,local_738[0]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") isn\'t ",8);
              std::ostream::operator<<(poVar1,local_7b8[0]);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
            else {
              local_630._0_4_ = local_7c8.order;
              local_630._4_4_ = local_7c8.type;
              poVar1 = (ostringstream *)(local_630 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"// Note: the return value at index ",0x23);
              std::ostream::operator<<(poVar1,iVar10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (value ",8);
              std::ostream::operator<<(poVar1,local_738[uVar15 & 0xffffffff]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"is neither ",0xb);
              std::ostream::operator<<(poVar1,local_738[(long)iVar10 + -1]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1," (the one just before it) ",0x1a);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"nor ",4);
              piVar5 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                 (local_7b8,local_7a4,local_738 + (long)iVar10 + -1);
              std::ostream::operator<<
                        (poVar1,local_7b8[((long)piVar5 - (long)local_7b8) * 0x40000000 +
                                          0x100000000 >> 0x20]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,
                         " (the smallest value bigger than the one just before it)",0x38);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_630 + 8));
            std::ios_base::~ios_base(local_5b8);
            if (bVar2) {
              return local_7da;
            }
            break;
          }
          iVar13 = iVar13 + 1;
          bVar2 = iVar13 < local_798->m_endResultImageWidth;
        } while (iVar13 < local_798->m_endResultImageWidth);
      }
      lVar9 = lVar9 + 1;
      lVar11 = (long)(local_7c0->m_size).m_data[1];
      local_7da = lVar11 <= lVar9;
    } while (lVar9 < lVar11);
  }
  return local_7da;
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		DE_ASSERT(isFormatTypeInteger(resultSlice.getFormat().type));
		DE_ASSERT(resultSlice.getWidth() == NUM_INVOCATIONS_PER_PIXEL*m_endResultImageWidth);

		log << TestLog::Image("ReturnValues" + toString(sliceOrFaceNdx),
							  "Per-Invocation Return Values, "
								   + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																	  : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < resultSlice.getHeight(); y++)
		for (int x = 0; x < m_endResultImageWidth; x++)
		{
			// Get the atomic function args and return values for all the invocations that contribute to the pixel (x, y) in the current end result slice.

			int		returnValues[NUM_INVOCATIONS_PER_PIXEL];
			int		compareArgs[NUM_INVOCATIONS_PER_PIXEL];
			IVec3	invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			IVec2	pixelCoords[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec2 pixCoord	(x + i*m_endResultImageWidth, y);
				const IVec3 gid			(pixCoord.x(), pixCoord.y(), sliceOrFaceNdx);

				pixelCoords[i]			= pixCoord;
				invocationGlobalIDs[i]	= gid;
				returnValues[i]			= resultSlice.getPixelInt(gid.x(), y).x();
				compareArgs[i]			= getCompareArg(gid, m_endResultImageWidth);
			}

			// Verify that the return values form a valid sequence.
			// Due to the way the compare and assign arguments to the atomic calls are organized
			// among the different invocations contributing to the same pixel -- i.e. one invocation
			// compares to A and assigns B, another compares to B and assigns C, and so on, where
			// A<B<C etc -- the first value in the return value sequence must be A, and each following
			// value must be either the same as or the smallest value (among A, B, C, ...) bigger than
			// the one just before it. E.g. sequences A A A A A A A A, A B C D E F G H and
			// A A B B B C D E are all valid sequences (if there were 8 invocations contributing
			// to each pixel).

			{
				int failingNdx = -1;

				{
					int currentAtomicValueNdx = 0;
					for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
					{
						if (returnValues[i] == compareArgs[currentAtomicValueNdx])
							continue;
						if (i > 0 && returnValues[i] == compareArgs[currentAtomicValueNdx+1])
						{
							currentAtomicValueNdx++;
							continue;
						}
						failingNdx = i;
						break;
					}
				}

				if (failingNdx >= 0)
				{
					log << TestLog::Message << "// Failure: intermediate return values at pixels " << arrayStr(pixelCoords) << " of current layer are "
											<< arrayStr(returnValues) << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: 'compare' argument values for the IDs are " << arrayStr(compareArgs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: expected the return value sequence to fulfill the following conditions:\n"
											<< "// - first value is " << compareArgs[0] << "\n"
											<< "// - each value other than the first is either the same as the one just before it, or the smallest value (in the sequence "
											<< arrayStr(compareArgs) << ") bigger than the one just before it" << TestLog::EndMessage;
					if (failingNdx == 0)
						log << TestLog::Message << "// Note: the first return value (" << returnValues[0] << ") isn't " << compareArgs[0] << TestLog::EndMessage;
					else
						log << TestLog::Message << "// Note: the return value at index " << failingNdx << " (value " << returnValues[failingNdx] << ") "
												<< "is neither " << returnValues[failingNdx-1] << " (the one just before it) "
												<< "nor " << compareArgs[arrayIndexOf(compareArgs, returnValues[failingNdx-1])+1] << " (the smallest value bigger than the one just before it)"
												<< TestLog::EndMessage;

					return false;
				}
			}
		}

		return true;
	}